

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

Gia_Man_t * Mf_ManDeriveMappingGia(Mf_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Jf_Par_t *pJVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  void *pvVar7;
  Vec_Mem_t *pVVar8;
  undefined4 *__s;
  Vec_Int_t *p_00;
  int *piVar9;
  Vec_Int_t *p_01;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  size_t sVar10;
  char *pcVar11;
  Gia_Man_t *pGVar12;
  Gia_Obj_t *pGVar13;
  int iVar14;
  uint uVar15;
  Vec_Int_t *pVVar16;
  int Fill;
  int Fill_00;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  
  pGVar12 = p->pGia;
  uVar1 = pGVar12->nObjs;
  uVar17 = (ulong)(int)uVar1;
  uVar21 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar21 = uVar1;
  }
  if (uVar21 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)(int)uVar21 << 2);
  }
  if (__s != (undefined4 *)0x0) {
    memset(__s,0xff,uVar17 * 4);
  }
  pJVar4 = p->pPars;
  iVar2 = (int)pJVar4->Edge;
  iVar22 = pGVar12->nObjs + (int)pJVar4->Area;
  iVar3 = iVar2 + iVar22 * 2;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < (iVar2 + iVar22 * 2) - 1U) {
    iVar14 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar14;
  if (iVar14 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar14 << 2);
  }
  p_00->pArray = piVar9;
  p_00->nSize = iVar3;
  if (piVar9 != (int *)0x0) {
    memset(piVar9,0,(long)iVar3 << 2);
  }
  iVar3 = (int)pJVar4->Area;
  iVar2 = (int)pJVar4->Edge;
  iVar22 = iVar2 + iVar3 * 2 + 1000;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar2 + iVar3 * 2 + 999U) {
    iVar14 = iVar22;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar14;
  if (iVar14 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar14 << 2);
  }
  p_01->pArray = piVar9;
  p_01->nSize = iVar22;
  if (piVar9 != (int *)0x0) {
    memset(piVar9,0,(long)iVar22 << 2);
  }
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar9 = (int *)malloc(0x40000);
  vMemory->pArray = piVar9;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar9 = (int *)malloc(0x40);
  p_02->pArray = piVar9;
  if (pJVar4->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x514,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
  }
  p_03 = Gia_ManStart(pGVar12->nObjs);
  pGVar12 = p->pGia;
  pcVar5 = pGVar12->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar5);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar5);
  }
  p_03->pName = pcVar11;
  pcVar5 = pGVar12->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar5);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar5);
  }
  p_03->pSpec = pcVar11;
  if ((int)uVar1 < 1) {
LAB_0076ea02:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  pGVar12 = p->pGia;
  pVVar16 = pGVar12->vCis;
  if (0 < pVVar16->nSize) {
    lVar18 = 0;
    do {
      iVar3 = pVVar16->pArray[lVar18];
      if (((long)iVar3 < 0) || (pGVar12->nObjs <= iVar3)) goto LAB_0076e986;
      if (iVar3 == 0) break;
      pGVar13 = Gia_ManAppendObj(p_03);
      uVar19 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar19 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar19 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_03->pObjs;
      if ((pGVar13 < pGVar6) || (pGVar6 + p_03->nObjs <= pGVar13)) {
LAB_0076e9a5:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_03->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_03->pObjs;
      if ((pGVar13 < pGVar6) || (pGVar6 + p_03->nObjs <= pGVar13)) goto LAB_0076e9a5;
      if ((int)uVar1 <= iVar3) goto LAB_0076ea02;
      __s[iVar3] = (int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pGVar12 = p->pGia;
      pVVar16 = pGVar12->vCis;
    } while (lVar18 < pVVar16->nSize);
  }
  pGVar12 = p->pGia;
  if (0 < pGVar12->nObjs) {
    uVar19 = 0;
    do {
      if (pGVar12->pObjs == (Gia_Obj_t *)0x0) break;
      uVar21 = *(uint *)(pGVar12->pObjs + uVar19);
      if ((~uVar21 & 0x1fffffff) != 0 && -1 < (int)uVar21) {
        if (0xffff < *(uint *)&p->pLfObjs[uVar19].field_0xc) {
          uVar21 = p->pLfObjs[uVar19].iCutSet;
          uVar15 = (int)uVar21 >> 0x10;
          if (((int)uVar15 < 0) || ((p->vPages).nSize <= (int)uVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar7 = (p->vPages).pArray[uVar15];
          uVar23 = (ulong)(uVar21 & 0xffff);
          uVar21 = *(uint *)((long)pvVar7 + uVar23 * 4 + 4);
          if ((uVar21 & 0x1f) == 1) {
            if ((uVar21 & 0xffffffc0) != 0x40) {
              __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                            ,0x52b,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
            }
            uVar15 = *(uint *)((long)pvVar7 + uVar23 * 4 + 8);
            if (uVar1 <= uVar15) goto LAB_0076e9c4;
            if ((int)__s[uVar15] < 0) goto LAB_0076ea21;
            if (uVar17 <= uVar19) goto LAB_0076ea02;
            __s[uVar19] = __s[uVar15] ^ uVar21 >> 5 & 1;
          }
          else if ((uVar21 & 0x1f) == 0) {
            if (0x3f < uVar21) {
              __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                            ,0x525,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
            }
            if (uVar17 <= uVar19) goto LAB_0076ea02;
            __s[uVar19] = uVar21 >> 5;
          }
          else {
            p_02->nSize = 0;
            uVar21 = *(uint *)((long)pvVar7 + uVar23 * 4 + 4);
            if ((uVar21 & 0x1f) != 0) {
              uVar20 = 0;
              do {
                uVar21 = *(uint *)((long)pvVar7 + uVar20 * 4 + uVar23 * 4 + 8);
                if (uVar1 <= uVar21) goto LAB_0076e9c4;
                Vec_IntPush(p_02,__s[uVar21]);
                uVar21 = *(uint *)((long)pvVar7 + uVar23 * 4 + 4);
                uVar20 = uVar20 + 1;
              } while (uVar20 < (uVar21 & 0x1f));
            }
            pVVar8 = p->vTtMem;
            uVar21 = uVar21 >> 6;
            if (pVVar8->nEntries <= (int)uVar21) {
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            uVar21 = Kit_TruthToGia(p_03,(uint *)(pVVar8->ppPages
                                                  [uVar21 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                                                 (ulong)(uVar21 & pVVar8->PageMask) *
                                                 (long)pVVar8->nEntrySize),p_02->nSize,vMemory,p_02,
                                    0);
            if ((int)uVar21 < 0) goto LAB_0076ea21;
            if (uVar17 <= uVar19) goto LAB_0076ea02;
            __s[uVar19] = *(uint *)((long)pvVar7 + uVar23 * 4 + 4) >> 5 & 1 ^ uVar21;
            uVar21 = uVar21 >> 1;
            iVar3 = p_01->nSize;
            Vec_IntFillExtra(p_00,uVar21 + 1,Fill);
            if (p_00->nSize <= (int)uVar21) goto LAB_0076ea02;
            p_00->pArray[uVar21] = iVar3;
            Vec_IntPush(p_01,p_02->nSize);
            if (0 < p_02->nSize) {
              lVar18 = 0;
              do {
                if (p_02->pArray[lVar18] < 0) goto LAB_0076e9e3;
                Vec_IntPush(p_01,(uint)p_02->pArray[lVar18] >> 1);
                lVar18 = lVar18 + 1;
              } while (lVar18 < p_02->nSize);
            }
            if ((int)__s[uVar19] < 0) {
LAB_0076e9e3:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            Vec_IntPush(p_01,(uint)__s[uVar19] >> 1);
          }
        }
      }
      uVar19 = uVar19 + 1;
      pGVar12 = p->pGia;
    } while ((long)uVar19 < (long)pGVar12->nObjs);
  }
  pGVar12 = p->pGia;
  pVVar16 = pGVar12->vCos;
  if (0 < pVVar16->nSize) {
    lVar18 = 0;
    do {
      iVar3 = pVVar16->pArray[lVar18];
      if (((long)iVar3 < 0) || (pGVar12->nObjs <= iVar3)) {
LAB_0076e986:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar12->pObjs == (Gia_Obj_t *)0x0) break;
      uVar21 = *(uint *)(pGVar12->pObjs + iVar3);
      uVar15 = iVar3 - (uVar21 & 0x1fffffff);
      if (uVar1 <= uVar15) {
LAB_0076e9c4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((int)__s[uVar15] < 0) {
LAB_0076ea21:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_03,__s[uVar15] ^ uVar21 >> 0x1d & 1);
      lVar18 = lVar18 + 1;
      pGVar12 = p->pGia;
      pVVar16 = pGVar12->vCos;
    } while (lVar18 < pVVar16->nSize);
  }
  free(__s);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (int *)0x0;
  }
  free(p_02);
  iVar3 = p_03->nObjs;
  if (iVar3 < p_00->nSize) {
    p_00->nSize = iVar3;
  }
  else {
    Vec_IntFillExtra(p_00,iVar3,Fill_00);
  }
  if (p_00->nSize != p_03->nObjs) {
    __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x54a,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
  }
  if (0 < p_00->nSize) {
    piVar9 = p_00->pArray;
    lVar18 = 0;
    do {
      iVar3 = piVar9[lVar18];
      if (0 < iVar3) {
        piVar9[lVar18] = iVar3 + p_03->nObjs;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < p_00->nSize);
  }
  iVar3 = p_01->nSize;
  if (0 < (long)iVar3) {
    piVar9 = p_01->pArray;
    lVar18 = 0;
    do {
      Vec_IntPush(p_00,piVar9[lVar18]);
      lVar18 = lVar18 + 1;
    } while (iVar3 != lVar18);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p_03->vMapping == (Vec_Int_t *)0x0) {
    p_03->vMapping = p_00;
    Gia_ManSetRegNum(p_03,p->pGia->nRegs);
    return p_03;
  }
  __assert_fail("pNew->vMapping == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x551,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
}

Assistant:

Gia_Man_t * Mf_ManDeriveMappingGia( Mf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, Id, iLit, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Vec_IntWriteEntry( vCopies, Id, Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        if ( Mf_CutSize(pCut) == 0 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 0 );
            Vec_IntWriteEntry( vCopies, i, Mf_CutFunc(pCut) );
            continue;
        }
        if ( Mf_CutSize(pCut) == 1 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut[1] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
            continue;
        }
        Vec_IntClear( vLeaves );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vLeaves, Vec_IntEntry(vCopies, pCut[k]) );
        pTruth = Vec_MemReadEntry( p->vTtMem, Abc_Lit2Var(Mf_CutFunc(pCut)) );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}